

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADRender.cpp
# Opt level: O3

void adaptive_distributed_render_scene
               (Scene *scene,double HalfWidth,double HalfHeight,int nx,int ny,int nxSub,int nySub,
               double Variance,char *PicFileName)

{
  short sVar1;
  short sVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  TargaImage *this;
  int iVar7;
  int iVar8;
  int jSub;
  int iVar9;
  int iVar10;
  ushort uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  Ray ray;
  int local_144;
  double local_140;
  double local_130;
  double local_128;
  double local_108;
  double dStack_100;
  Color local_78;
  Ray local_60;
  
  this = (TargaImage *)operator_new(0x40);
  TargaImage::TargaImage(this,PicFileName,nx,ny,(char *)0x0);
  if (0 < ny) {
    dVar18 = (HalfWidth + HalfWidth) / (double)nx;
    dVar19 = (HalfHeight + HalfHeight) / (double)ny;
    local_144 = 0;
    iVar7 = 0;
    if (0 < nySub) {
      iVar7 = nySub;
    }
    local_140 = HalfHeight;
    do {
      if (0 < nx) {
        iVar4 = 0;
        dVar13 = -HalfWidth;
        do {
          TotalPixels = TotalPixels + 1;
          local_108 = 0.0;
          dStack_100 = 0.0;
          local_128 = 0.0;
          iVar8 = 0;
          local_130 = 0.0;
          do {
            if (0 < nxSub) {
              iVar8 = iVar8 + iVar7 * nxSub;
              iVar10 = 0;
              do {
                if (0 < nySub) {
                  iVar9 = 0;
                  do {
                    iVar5 = rand();
                    iVar6 = rand();
                    Scene::camera(scene,((double)iVar5 / 2147483647.0 + (double)iVar10) *
                                        (dVar18 / (double)nxSub) + dVar18 * -0.5 + dVar13,
                                  ((double)iVar6 / 2147483647.0 + (double)iVar9) *
                                  (dVar19 / (double)nySub) + dVar19 * -0.5 + local_140,&local_60);
                    Scene::trace(&local_78,scene,&Grayzer::Medium::air,1.0,&local_60);
                    local_128 = local_128 + local_78.x;
                    local_108 = local_108 + local_78.y;
                    dStack_100 = dStack_100 + local_78.z;
                    local_130 = local_130 +
                                local_78.z * local_78.z +
                                local_78.x * local_78.x + local_78.y * local_78.y;
                    iVar9 = iVar9 + 1;
                  } while (nySub != iVar9);
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 != nxSub);
            }
            dVar17 = (double)iVar8;
            dVar12 = local_128 / dVar17;
            auVar3._8_8_ = dStack_100;
            auVar3._0_8_ = local_108;
            auVar15._8_8_ = dVar17;
            auVar15._0_8_ = dVar17;
            auVar15 = divpd(auVar3,auVar15);
            dVar14 = auVar15._0_8_;
            dVar16 = auVar15._8_8_;
          } while ((Variance <=
                    (((local_130 / dVar17 - (dVar16 * dVar16 + dVar12 * dVar12 + dVar14 * dVar14)) *
                     dVar17) / (double)(iVar8 + -1)) / dVar17) && (iVar8 < 99));
          iVar8 = (int)(dVar14 * 255.0);
          iVar10 = (int)(dVar16 * 255.0);
          sVar1 = (short)iVar8;
          sVar2 = (short)((uint)iVar8 >> 0x10);
          uVar11 = CONCAT11((0 < sVar2) * (sVar2 < 0x100) * (char)((uint)iVar8 >> 0x10) -
                            (0xff < sVar2),
                            (0 < sVar1) * (sVar1 < 0x100) * (char)iVar8 - (0xff < sVar1));
          sVar1 = (short)iVar10;
          sVar2 = (short)((uint)iVar10 >> 0x10);
          (*(this->super_Image)._vptr_Image[3])
                    (this,(ulong)((int)(dVar12 * 255.0) & 0xffU |
                                 CONCAT13((0 < sVar2) * (sVar2 < 0x100) *
                                          (char)((uint)iVar10 >> 0x10) - (0xff < sVar2),
                                          CONCAT12((0 < sVar1) * (sVar1 < 0x100) * (char)iVar10 -
                                                   (0xff < sVar1),uVar11)) & 0xffff0000 |
                                 (uint)uVar11 << 8));
          iVar4 = iVar4 + 1;
          dVar13 = dVar13 + dVar18;
        } while (iVar4 != nx);
      }
      local_144 = local_144 + 1;
      local_140 = local_140 - dVar19;
    } while (local_144 != ny);
  }
  (*(this->super_Image)._vptr_Image[1])();
  return;
}

Assistant:

void adaptive_distributed_render_scene(
   Scene* scene,
   double HalfWidth,double HalfHeight,
   int   nx,int ny,int nxSub,int nySub,
   double Variance,
   char const*PicFileName)
{
   double x,y;                // sample point
   Ray   ray;                 // pixel ray
   double hx = 2.0   * HalfWidth / nx;   // pixel width
   double hy = 2.0   * HalfHeight / ny;     // pixel height
   double hxSub = hx /  nxSub;
   double hySub = hy /  nySub;
   double Disp;               // dispersion squared
   int   i,j;
   Vector Color;
   Vector Sum;
   Vector Mean;
   int   Count;

   auto tga = std::make_unique<TargaImage>(PicFileName, nx, ny);
   rgb   c;

   for(i = 0, y = HalfHeight; i < ny; i++, y -= hy)
   {
      for(j = 0, x = -HalfWidth; j < nx; j++, x += hx)
      {
         double x1 = x - 0.5 * hx;
         double y1 = y - 0.5 * hy;
         double d;

         Sum   = 0;
         Disp  = 0;
         Count = 0;

         TotalPixels++;

         do {
            for(int  iSub = 0; iSub < nxSub; iSub++)
            {
               for(int  jSub = 0; jSub < nySub; jSub++)
               {
                  scene->camera(x1+hxSub*(iSub+rnd()),y1+hySub*(jSub+rnd()),ray);
                  Color = scene->trace( Grayzer::Medium::air, 1.0, ray );
                  Sum  += Color;
                  Disp += Color & Color;
                  Count++;
               }
            }
            Mean = Sum / Count;
            d =   (Disp /  Count -  (Mean &  Mean)) * Count / (Count - 1);
         } while(d / Count >= Variance && Count < 99);

         clip( Mean );
         c.r   = Mean.x * 255;
         c.g   = Mean.y * 255;
         c.b   = Mean.z * 255;

         tga->put_pixel(c);
      }
   }
}